

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

bool duckdb::ZSTDStorage::StringAnalyze(AnalyzeState *state_p,Vector *input,idx_t count)

{
  sel_t *psVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  _func_int **pp_Var4;
  idx_t iVar5;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  if (count != 0) {
    psVar1 = (local_78.sel)->sel_vector;
    iVar5 = 0;
    do {
      iVar3 = iVar5;
      if (psVar1 != (sel_t *)0x0) {
        iVar3 = (idx_t)psVar1[iVar5];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6] >>
           (iVar3 & 0x3f) & 1) != 0)) {
        state_p[2]._vptr_AnalyzeState =
             (_func_int **)
             ((long)state_p[2]._vptr_AnalyzeState + (ulong)*(uint *)(local_78.data + iVar3 * 0x10));
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  pBVar2 = (BlockManager *)((long)&(state_p[4].info.block_manager)->_vptr_BlockManager + count);
  state_p[4].info.block_manager = pBVar2;
  while ((BlockManager *)0x7ff < pBVar2) {
    pBVar2 = (state_p->info).block_manager;
    pp_Var4 = state_p[4]._vptr_AnalyzeState;
    iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar3 = optional_idx::GetIndex(&pBVar2->block_header_size);
    if ((iVar5 - iVar3) - 8 <
        ((long)pp_Var4 * 0x14 + 0x1bU & 0xfffffffffffffff8) + (long)pp_Var4 * 8 + 8) {
      state_p[3]._vptr_AnalyzeState = state_p[4]._vptr_AnalyzeState;
      state_p[3].info.block_manager =
           (BlockManager *)((long)&(state_p[3].info.block_manager)->_vptr_BlockManager + 1);
      pp_Var4 = (_func_int **)0x0;
    }
    else {
      pp_Var4 = (_func_int **)((long)state_p[4]._vptr_AnalyzeState + 1);
    }
    state_p[4]._vptr_AnalyzeState = pp_Var4;
    pBVar2 = (BlockManager *)&state_p[4].info.block_manager[-0x10].block_header_size;
    state_p[4].info.block_manager = pBVar2;
  }
  state_p[2].info.block_manager =
       (BlockManager *)((long)&(state_p[2].info.block_manager)->_vptr_BlockManager + count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool ZSTDStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<ZSTDAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			continue;
		}
		auto &str = data[idx];
		auto string_size = str.GetSize();
		state.total_size += string_size;
	}
	state.values_in_vector += count;
	while (state.values_in_vector >= ZSTD_VECTOR_SIZE) {
		if (GetVectorMetadataSize(state.vectors_in_segment + 1) > GetWritableSpace(state.info)) {
			state.vectors_per_segment = state.vectors_in_segment;
			state.segment_count++;
			state.vectors_in_segment = 0;
		} else {
			state.vectors_in_segment++;
		}
		state.values_in_vector -= ZSTD_VECTOR_SIZE;
	}
	state.count += count;
	return true;
}